

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O0

void CompiledMixedType<signed_char,int>(void)

{
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_00;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> i;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_01;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_02;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> bits;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> bits_00;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_03;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_04;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_05;
  int u2;
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> st2;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> su;
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> st;
  bool b;
  char t;
  int u;
  undefined4 in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffed0;
  undefined2 in_stack_fffffffffffffed4;
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffed6;
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffed7;
  undefined1 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffed9;
  undefined1 in_stack_fffffffffffffeda;
  undefined4 in_stack_fffffffffffffedb;
  char in_stack_fffffffffffffedf;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffee0;
  undefined2 in_stack_fffffffffffffee4;
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffee6;
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffee7;
  undefined1 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffee9;
  undefined1 in_stack_fffffffffffffeea;
  undefined1 in_stack_fffffffffffffeeb;
  undefined4 in_stack_fffffffffffffeec;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffef0;
  undefined4 local_c;
  byte local_6;
  char local_5;
  int local_4;
  
  local_4 = 0;
  local_5 = 0;
  local_6 = 0;
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt<int>((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                *)CONCAT17(in_stack_fffffffffffffed7.m_int,
                           CONCAT16(in_stack_fffffffffffffed6.m_int,
                                    CONCAT24(in_stack_fffffffffffffed4,
                                             in_stack_fffffffffffffed0.m_int))),
               (int *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )&local_c,&local_4);
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt<int>((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                *)CONCAT17(in_stack_fffffffffffffee7.m_int,
                           CONCAT16(in_stack_fffffffffffffee6.m_int,
                                    CONCAT24(in_stack_fffffffffffffee4,
                                             in_stack_fffffffffffffee0.m_int))),
               (SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                *)CONCAT17(in_stack_fffffffffffffedf,
                           CONCAT43(in_stack_fffffffffffffedb,
                                    CONCAT12(in_stack_fffffffffffffeda,
                                             CONCAT11(in_stack_fffffffffffffed9,
                                                      in_stack_fffffffffffffed8)))));
  local_6 = (local_6 ^ 0xff) & 1;
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT17(in_stack_fffffffffffffee7.m_int,
                        CONCAT16(in_stack_fffffffffffffee6.m_int,
                                 CONCAT24(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0.m_int)
                                )),
            (char *)CONCAT17(in_stack_fffffffffffffedf,
                             CONCAT43(in_stack_fffffffffffffedb,
                                      CONCAT12(in_stack_fffffffffffffeda,
                                               CONCAT11(in_stack_fffffffffffffed9,
                                                        in_stack_fffffffffffffed8)))));
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT17(in_stack_fffffffffffffee7.m_int,
                        CONCAT16(in_stack_fffffffffffffee6.m_int,
                                 CONCAT24(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0.m_int)
                                )),
            (int *)CONCAT17(in_stack_fffffffffffffedf,
                            CONCAT43(in_stack_fffffffffffffedb,
                                     CONCAT12(in_stack_fffffffffffffeda,
                                              CONCAT11(in_stack_fffffffffffffed9,
                                                       in_stack_fffffffffffffed8)))));
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT17(in_stack_fffffffffffffed7.m_int,
                        CONCAT16(in_stack_fffffffffffffed6.m_int,
                                 CONCAT24(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0.m_int)
                                )),
            (SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *)
            CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  SafeInt::operator_cast_to_int
            ((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_fffffffffffffed7.m_int,
                         CONCAT16(in_stack_fffffffffffffed6.m_int,
                                  CONCAT24(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0.m_int
                                          ))));
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator*((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),0);
  local_5 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffed7.m_int,
                                   CONCAT16(in_stack_fffffffffffffed6.m_int,
                                            CONCAT24(in_stack_fffffffffffffed4,
                                                     in_stack_fffffffffffffed0.m_int))));
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator*((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT17(in_stack_fffffffffffffedf,
                        CONCAT43(in_stack_fffffffffffffedb,
                                 CONCAT12(in_stack_fffffffffffffeda,
                                          CONCAT11(in_stack_fffffffffffffed9,
                                                   in_stack_fffffffffffffed8)))),
            in_stack_fffffffffffffee6);
  local_5 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffed7.m_int,
                                   CONCAT16(in_stack_fffffffffffffed6.m_int,
                                            CONCAT24(in_stack_fffffffffffffed4,
                                                     in_stack_fffffffffffffed0.m_int))));
  operator*(in_stack_fffffffffffffed0.m_int,in_stack_fffffffffffffed6);
  local_5 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffed7.m_int,
                                   CONCAT16(in_stack_fffffffffffffed6.m_int,
                                            CONCAT24(in_stack_fffffffffffffed4,
                                                     in_stack_fffffffffffffed0.m_int))));
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator*=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_fffffffffffffed7.m_int,
                         CONCAT16(in_stack_fffffffffffffed6.m_int,
                                  CONCAT24(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0.m_int
                                          ))),in_stack_fffffffffffffecc);
  rhs.m_int._2_1_ = in_stack_fffffffffffffed6.m_int;
  rhs.m_int._0_2_ = in_stack_fffffffffffffed4;
  rhs.m_int._3_1_ = in_stack_fffffffffffffed7.m_int;
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator*=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),rhs);
  local_4 = 1;
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT17(in_stack_fffffffffffffee7.m_int,
                        CONCAT16(in_stack_fffffffffffffee6.m_int,
                                 CONCAT24(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0.m_int)
                                )),
            (int *)CONCAT17(in_stack_fffffffffffffedf,
                            CONCAT43(in_stack_fffffffffffffedb,
                                     CONCAT12(in_stack_fffffffffffffeda,
                                              CONCAT11(in_stack_fffffffffffffed9,
                                                       in_stack_fffffffffffffed8)))));
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT17(in_stack_fffffffffffffee7.m_int,
                       CONCAT16(in_stack_fffffffffffffee6.m_int,
                                CONCAT24(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0.m_int))
                      ),
             (int *)CONCAT17(in_stack_fffffffffffffedf,
                             CONCAT43(in_stack_fffffffffffffedb,
                                      CONCAT12(in_stack_fffffffffffffeda,
                                               CONCAT11(in_stack_fffffffffffffed9,
                                                        in_stack_fffffffffffffed8)))));
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator%((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),0);
  local_5 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffed7.m_int,
                                   CONCAT16(in_stack_fffffffffffffed6.m_int,
                                            CONCAT24(in_stack_fffffffffffffed4,
                                                     in_stack_fffffffffffffed0.m_int))));
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT17(in_stack_fffffffffffffee7.m_int,
                        CONCAT16(in_stack_fffffffffffffee6.m_int,
                                 CONCAT24(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0.m_int)
                                )),
            (int *)CONCAT17(in_stack_fffffffffffffedf,
                            CONCAT43(in_stack_fffffffffffffedb,
                                     CONCAT12(in_stack_fffffffffffffeda,
                                              CONCAT11(in_stack_fffffffffffffed9,
                                                       in_stack_fffffffffffffed8)))));
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator%((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT17(in_stack_fffffffffffffedf,
                        CONCAT43(in_stack_fffffffffffffedb,
                                 CONCAT12(in_stack_fffffffffffffeda,
                                          CONCAT11(in_stack_fffffffffffffed9,
                                                   in_stack_fffffffffffffed8)))),
            in_stack_fffffffffffffee6);
  local_5 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffed7.m_int,
                                   CONCAT16(in_stack_fffffffffffffed6.m_int,
                                            CONCAT24(in_stack_fffffffffffffed4,
                                                     in_stack_fffffffffffffed0.m_int))));
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator%=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_fffffffffffffed7.m_int,
                         CONCAT16(in_stack_fffffffffffffed6.m_int,
                                  CONCAT24(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0.m_int
                                          ))),in_stack_fffffffffffffecc);
  rhs_00.m_int._2_1_ = in_stack_fffffffffffffee6.m_int;
  rhs_00.m_int._0_2_ = in_stack_fffffffffffffee4;
  rhs_00.m_int._3_1_ = in_stack_fffffffffffffee7.m_int;
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator%=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_fffffffffffffedf,
                         CONCAT43(in_stack_fffffffffffffedb,
                                  CONCAT12(in_stack_fffffffffffffeda,
                                           CONCAT11(in_stack_fffffffffffffed9,
                                                    in_stack_fffffffffffffed8)))),rhs_00);
  local_4 = 1;
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT17(in_stack_fffffffffffffee7.m_int,
                        CONCAT16(in_stack_fffffffffffffee6.m_int,
                                 CONCAT24(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0.m_int)
                                )),
            (int *)CONCAT17(in_stack_fffffffffffffedf,
                            CONCAT43(in_stack_fffffffffffffedb,
                                     CONCAT12(in_stack_fffffffffffffeda,
                                              CONCAT11(in_stack_fffffffffffffed9,
                                                       in_stack_fffffffffffffed8)))));
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT17(in_stack_fffffffffffffee7.m_int,
                        CONCAT16(in_stack_fffffffffffffee6.m_int,
                                 CONCAT24(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0.m_int)
                                )),
            (int *)CONCAT17(in_stack_fffffffffffffedf,
                            CONCAT43(in_stack_fffffffffffffedb,
                                     CONCAT12(in_stack_fffffffffffffeda,
                                              CONCAT11(in_stack_fffffffffffffed9,
                                                       in_stack_fffffffffffffed8)))));
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator/((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),0);
  local_5 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffed7.m_int,
                                   CONCAT16(in_stack_fffffffffffffed6.m_int,
                                            CONCAT24(in_stack_fffffffffffffed4,
                                                     in_stack_fffffffffffffed0.m_int))));
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator/((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT17(in_stack_fffffffffffffedf,
                        CONCAT43(in_stack_fffffffffffffedb,
                                 CONCAT12(in_stack_fffffffffffffeda,
                                          CONCAT11(in_stack_fffffffffffffed9,
                                                   in_stack_fffffffffffffed8)))),
            in_stack_fffffffffffffee6);
  local_5 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffed7.m_int,
                                   CONCAT16(in_stack_fffffffffffffed6.m_int,
                                            CONCAT24(in_stack_fffffffffffffed4,
                                                     in_stack_fffffffffffffed0.m_int))));
  operator/(in_stack_fffffffffffffed0.m_int,in_stack_fffffffffffffed6);
  local_5 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffed7.m_int,
                                   CONCAT16(in_stack_fffffffffffffed6.m_int,
                                            CONCAT24(in_stack_fffffffffffffed4,
                                                     in_stack_fffffffffffffed0.m_int))));
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator/=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_fffffffffffffed7.m_int,
                         CONCAT16(in_stack_fffffffffffffed6.m_int,
                                  CONCAT24(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0.m_int
                                          ))),in_stack_fffffffffffffecc);
  i.m_int._2_1_ = in_stack_fffffffffffffee6.m_int;
  i.m_int._0_2_ = in_stack_fffffffffffffee4;
  i.m_int._3_1_ = in_stack_fffffffffffffee7.m_int;
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator/=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_fffffffffffffedf,
                         CONCAT43(in_stack_fffffffffffffedb,
                                  CONCAT12(in_stack_fffffffffffffeda,
                                           CONCAT11(in_stack_fffffffffffffed9,
                                                    in_stack_fffffffffffffed8)))),i);
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator+((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),0);
  local_5 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffed7.m_int,
                                   CONCAT16(in_stack_fffffffffffffed6.m_int,
                                            CONCAT24(in_stack_fffffffffffffed4,
                                                     in_stack_fffffffffffffed0.m_int))));
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator+((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT17(in_stack_fffffffffffffedf,
                        CONCAT43(in_stack_fffffffffffffedb,
                                 CONCAT12(in_stack_fffffffffffffeda,
                                          CONCAT11(in_stack_fffffffffffffed9,
                                                   in_stack_fffffffffffffed8)))),
            in_stack_fffffffffffffee6);
  local_5 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffed7.m_int,
                                   CONCAT16(in_stack_fffffffffffffed6.m_int,
                                            CONCAT24(in_stack_fffffffffffffed4,
                                                     in_stack_fffffffffffffed0.m_int))));
  operator+(in_stack_fffffffffffffed0.m_int,in_stack_fffffffffffffed6);
  local_5 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffed7.m_int,
                                   CONCAT16(in_stack_fffffffffffffed6.m_int,
                                            CONCAT24(in_stack_fffffffffffffed4,
                                                     in_stack_fffffffffffffed0.m_int))));
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator+=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_fffffffffffffed7.m_int,
                         CONCAT16(in_stack_fffffffffffffed6.m_int,
                                  CONCAT24(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0.m_int
                                          ))),in_stack_fffffffffffffecc);
  rhs_01.m_int._2_1_ = in_stack_fffffffffffffee6.m_int;
  rhs_01.m_int._0_2_ = in_stack_fffffffffffffee4;
  rhs_01.m_int._3_1_ = in_stack_fffffffffffffee7.m_int;
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator+=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_fffffffffffffedf,
                         CONCAT43(in_stack_fffffffffffffedb,
                                  CONCAT12(in_stack_fffffffffffffeda,
                                           CONCAT11(in_stack_fffffffffffffed9,
                                                    in_stack_fffffffffffffed8)))),rhs_01);
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT17(in_stack_fffffffffffffee7.m_int,
                        CONCAT16(in_stack_fffffffffffffee6.m_int,
                                 CONCAT24(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0.m_int)
                                )),
            (int *)CONCAT17(in_stack_fffffffffffffedf,
                            CONCAT43(in_stack_fffffffffffffedb,
                                     CONCAT12(in_stack_fffffffffffffeda,
                                              CONCAT11(in_stack_fffffffffffffed9,
                                                       in_stack_fffffffffffffed8)))));
  local_4 = 0;
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT17(in_stack_fffffffffffffee7.m_int,
                        CONCAT16(in_stack_fffffffffffffee6.m_int,
                                 CONCAT24(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0.m_int)
                                )),
            (int *)CONCAT17(in_stack_fffffffffffffedf,
                            CONCAT43(in_stack_fffffffffffffedb,
                                     CONCAT12(in_stack_fffffffffffffeda,
                                              CONCAT11(in_stack_fffffffffffffed9,
                                                       in_stack_fffffffffffffed8)))));
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator-((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),0);
  local_5 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffed7.m_int,
                                   CONCAT16(in_stack_fffffffffffffed6.m_int,
                                            CONCAT24(in_stack_fffffffffffffed4,
                                                     in_stack_fffffffffffffed0.m_int))));
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator-((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT17(in_stack_fffffffffffffedf,
                        CONCAT43(in_stack_fffffffffffffedb,
                                 CONCAT12(in_stack_fffffffffffffeda,
                                          CONCAT11(in_stack_fffffffffffffed9,
                                                   in_stack_fffffffffffffed8)))),
            in_stack_fffffffffffffee6);
  local_5 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffed7.m_int,
                                   CONCAT16(in_stack_fffffffffffffed6.m_int,
                                            CONCAT24(in_stack_fffffffffffffed4,
                                                     in_stack_fffffffffffffed0.m_int))));
  operator-(in_stack_fffffffffffffed0.m_int,in_stack_fffffffffffffed6);
  local_5 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffed7.m_int,
                                   CONCAT16(in_stack_fffffffffffffed6.m_int,
                                            CONCAT24(in_stack_fffffffffffffed4,
                                                     in_stack_fffffffffffffed0.m_int))));
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator-=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_fffffffffffffed7.m_int,
                         CONCAT16(in_stack_fffffffffffffed6.m_int,
                                  CONCAT24(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0.m_int
                                          ))),in_stack_fffffffffffffecc);
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT17(in_stack_fffffffffffffee7.m_int,
                        CONCAT16(in_stack_fffffffffffffee6.m_int,
                                 CONCAT24(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0.m_int)
                                )),
            (int *)CONCAT17(in_stack_fffffffffffffedf,
                            CONCAT43(in_stack_fffffffffffffedb,
                                     CONCAT12(in_stack_fffffffffffffeda,
                                              CONCAT11(in_stack_fffffffffffffed9,
                                                       in_stack_fffffffffffffed8)))));
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT17(in_stack_fffffffffffffee7.m_int,
                       CONCAT16(in_stack_fffffffffffffee6.m_int,
                                CONCAT24(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0.m_int))
                      ),
             (int *)CONCAT17(in_stack_fffffffffffffedf,
                             CONCAT43(in_stack_fffffffffffffedb,
                                      CONCAT12(in_stack_fffffffffffffeda,
                                               CONCAT11(in_stack_fffffffffffffed9,
                                                        in_stack_fffffffffffffed8)))));
  rhs_02.m_int._2_1_ = in_stack_fffffffffffffee6.m_int;
  rhs_02.m_int._0_2_ = in_stack_fffffffffffffee4;
  rhs_02.m_int._3_1_ = in_stack_fffffffffffffee7.m_int;
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator-=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_fffffffffffffedf,
                         CONCAT43(in_stack_fffffffffffffedb,
                                  CONCAT12(in_stack_fffffffffffffeda,
                                           CONCAT11(in_stack_fffffffffffffed9,
                                                    in_stack_fffffffffffffed8)))),rhs_02);
  local_4 = 1;
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT17(in_stack_fffffffffffffee7.m_int,
                       CONCAT16(in_stack_fffffffffffffee6.m_int,
                                CONCAT24(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0.m_int))
                      ),
             (int *)CONCAT17(in_stack_fffffffffffffedf,
                             CONCAT43(in_stack_fffffffffffffedb,
                                      CONCAT12(in_stack_fffffffffffffeda,
                                               CONCAT11(in_stack_fffffffffffffed9,
                                                        in_stack_fffffffffffffed8)))));
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator<<((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_fffffffffffffedf,
                         CONCAT43(in_stack_fffffffffffffedb,
                                  CONCAT12(in_stack_fffffffffffffeda,
                                           CONCAT11(in_stack_fffffffffffffed9,
                                                    in_stack_fffffffffffffed8)))),
             CONCAT13(in_stack_fffffffffffffed7.m_int,
                      CONCAT12(in_stack_fffffffffffffed6.m_int,in_stack_fffffffffffffed4)));
  local_5 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffed7.m_int,
                                   CONCAT16(in_stack_fffffffffffffed6.m_int,
                                            CONCAT24(in_stack_fffffffffffffed4,
                                                     in_stack_fffffffffffffed0.m_int))));
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator<<((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT44(in_stack_fffffffffffffeec,
                         CONCAT13(in_stack_fffffffffffffeeb,
                                  CONCAT12(in_stack_fffffffffffffeea,
                                           CONCAT11(in_stack_fffffffffffffee9,
                                                    in_stack_fffffffffffffee8)))),
             in_stack_fffffffffffffef0);
  local_5 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffed7.m_int,
                                   CONCAT16(in_stack_fffffffffffffed6.m_int,
                                            CONCAT24(in_stack_fffffffffffffed4,
                                                     in_stack_fffffffffffffed0.m_int))));
  operator<<(in_stack_fffffffffffffedf,in_stack_fffffffffffffee0);
  local_5 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffed7.m_int,
                                   CONCAT16(in_stack_fffffffffffffed6.m_int,
                                            CONCAT24(in_stack_fffffffffffffed4,
                                                     in_stack_fffffffffffffed0.m_int))));
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator<<=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
               *)CONCAT17(in_stack_fffffffffffffed7.m_int,
                          CONCAT16(in_stack_fffffffffffffed6.m_int,
                                   CONCAT24(in_stack_fffffffffffffed4,
                                            in_stack_fffffffffffffed0.m_int))),
              in_stack_fffffffffffffecc);
  bits.m_int._2_1_ = in_stack_fffffffffffffee6.m_int;
  bits.m_int._0_2_ = in_stack_fffffffffffffee4;
  bits.m_int._3_1_ = in_stack_fffffffffffffee7.m_int;
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator<<=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
               *)CONCAT17(in_stack_fffffffffffffedf,
                          CONCAT43(in_stack_fffffffffffffedb,
                                   CONCAT12(in_stack_fffffffffffffeda,
                                            CONCAT11(in_stack_fffffffffffffed9,
                                                     in_stack_fffffffffffffed8)))),bits);
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator>>((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_fffffffffffffedf,
                         CONCAT43(in_stack_fffffffffffffedb,
                                  CONCAT12(in_stack_fffffffffffffeda,
                                           CONCAT11(in_stack_fffffffffffffed9,
                                                    in_stack_fffffffffffffed8)))),
             CONCAT13(in_stack_fffffffffffffed7.m_int,
                      CONCAT12(in_stack_fffffffffffffed6.m_int,in_stack_fffffffffffffed4)));
  local_5 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffed7.m_int,
                                   CONCAT16(in_stack_fffffffffffffed6.m_int,
                                            CONCAT24(in_stack_fffffffffffffed4,
                                                     in_stack_fffffffffffffed0.m_int))));
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator>>((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT44(in_stack_fffffffffffffeec,
                         CONCAT13(in_stack_fffffffffffffeeb,
                                  CONCAT12(in_stack_fffffffffffffeea,
                                           CONCAT11(in_stack_fffffffffffffee9,
                                                    in_stack_fffffffffffffee8)))),
             in_stack_fffffffffffffef0);
  local_5 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffed7.m_int,
                                   CONCAT16(in_stack_fffffffffffffed6.m_int,
                                            CONCAT24(in_stack_fffffffffffffed4,
                                                     in_stack_fffffffffffffed0.m_int))));
  operator>>(in_stack_fffffffffffffedf,in_stack_fffffffffffffee0);
  local_5 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffed7.m_int,
                                   CONCAT16(in_stack_fffffffffffffed6.m_int,
                                            CONCAT24(in_stack_fffffffffffffed4,
                                                     in_stack_fffffffffffffed0.m_int))));
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator>>=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
               *)CONCAT17(in_stack_fffffffffffffed7.m_int,
                          CONCAT16(in_stack_fffffffffffffed6.m_int,
                                   CONCAT24(in_stack_fffffffffffffed4,
                                            in_stack_fffffffffffffed0.m_int))),
              in_stack_fffffffffffffecc);
  bits_00.m_int._2_1_ = in_stack_fffffffffffffee6.m_int;
  bits_00.m_int._0_2_ = in_stack_fffffffffffffee4;
  bits_00.m_int._3_1_ = in_stack_fffffffffffffee7.m_int;
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator>>=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
               *)CONCAT17(in_stack_fffffffffffffedf,
                          CONCAT43(in_stack_fffffffffffffedb,
                                   CONCAT12(in_stack_fffffffffffffeda,
                                            CONCAT11(in_stack_fffffffffffffed9,
                                                     in_stack_fffffffffffffed8)))),bits_00);
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator&((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT17(in_stack_fffffffffffffedf,
                        CONCAT43(in_stack_fffffffffffffedb,
                                 CONCAT12(in_stack_fffffffffffffeda,
                                          CONCAT11(in_stack_fffffffffffffed9,
                                                   in_stack_fffffffffffffed8)))),
            in_stack_fffffffffffffee6);
  local_5 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffed7.m_int,
                                   CONCAT16(in_stack_fffffffffffffed6.m_int,
                                            CONCAT24(in_stack_fffffffffffffed4,
                                                     in_stack_fffffffffffffed0.m_int))));
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator&((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),0);
  local_5 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffed7.m_int,
                                   CONCAT16(in_stack_fffffffffffffed6.m_int,
                                            CONCAT24(in_stack_fffffffffffffed4,
                                                     in_stack_fffffffffffffed0.m_int))));
  operator&((char)((uint)in_stack_fffffffffffffecc >> 0x18),in_stack_fffffffffffffed0);
  local_5 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffed7.m_int,
                                   CONCAT16(in_stack_fffffffffffffed6.m_int,
                                            CONCAT24(in_stack_fffffffffffffed4,
                                                     in_stack_fffffffffffffed0.m_int))));
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator&=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_fffffffffffffedf,
                         CONCAT43(in_stack_fffffffffffffedb,
                                  CONCAT12(in_stack_fffffffffffffeda,
                                           CONCAT11(in_stack_fffffffffffffed9,
                                                    in_stack_fffffffffffffed8)))),
             in_stack_fffffffffffffee7);
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator&=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_fffffffffffffed7.m_int,
                         CONCAT16(in_stack_fffffffffffffed6.m_int,
                                  CONCAT24(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0.m_int
                                          ))),in_stack_fffffffffffffecc);
  rhs_03.m_int._2_1_ = in_stack_fffffffffffffee6.m_int;
  rhs_03.m_int._0_2_ = in_stack_fffffffffffffee4;
  rhs_03.m_int._3_1_ = in_stack_fffffffffffffee7.m_int;
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator&=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_fffffffffffffedf,
                         CONCAT43(in_stack_fffffffffffffedb,
                                  CONCAT12(in_stack_fffffffffffffeda,
                                           CONCAT11(in_stack_fffffffffffffed9,
                                                    in_stack_fffffffffffffed8)))),rhs_03);
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator|((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
            in_stack_fffffffffffffed6);
  local_5 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffed7.m_int,
                                   CONCAT16(in_stack_fffffffffffffed6.m_int,
                                            CONCAT24(in_stack_fffffffffffffed4,
                                                     in_stack_fffffffffffffed0.m_int))));
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator|((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),0);
  local_5 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffed7.m_int,
                                   CONCAT16(in_stack_fffffffffffffed6.m_int,
                                            CONCAT24(in_stack_fffffffffffffed4,
                                                     in_stack_fffffffffffffed0.m_int))));
  operator|((char)((uint)in_stack_fffffffffffffecc >> 0x18),in_stack_fffffffffffffed0);
  local_5 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffed7.m_int,
                                   CONCAT16(in_stack_fffffffffffffed6.m_int,
                                            CONCAT24(in_stack_fffffffffffffed4,
                                                     in_stack_fffffffffffffed0.m_int))));
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator|=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_fffffffffffffedf,
                         CONCAT43(in_stack_fffffffffffffedb,
                                  CONCAT12(in_stack_fffffffffffffeda,
                                           CONCAT11(in_stack_fffffffffffffed9,
                                                    in_stack_fffffffffffffed8)))),
             in_stack_fffffffffffffee7);
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator|=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_fffffffffffffed7.m_int,
                         CONCAT16(in_stack_fffffffffffffed6.m_int,
                                  CONCAT24(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0.m_int
                                          ))),in_stack_fffffffffffffecc);
  rhs_04.m_int._2_1_ = in_stack_fffffffffffffee6.m_int;
  rhs_04.m_int._0_2_ = in_stack_fffffffffffffee4;
  rhs_04.m_int._3_1_ = in_stack_fffffffffffffee7.m_int;
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator|=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_fffffffffffffedf,
                         CONCAT43(in_stack_fffffffffffffedb,
                                  CONCAT12(in_stack_fffffffffffffeda,
                                           CONCAT11(in_stack_fffffffffffffed9,
                                                    in_stack_fffffffffffffed8)))),rhs_04);
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator^((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
            in_stack_fffffffffffffed6);
  local_5 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffed7.m_int,
                                   CONCAT16(in_stack_fffffffffffffed6.m_int,
                                            CONCAT24(in_stack_fffffffffffffed4,
                                                     in_stack_fffffffffffffed0.m_int))));
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator^((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),0);
  local_5 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffed7.m_int,
                                   CONCAT16(in_stack_fffffffffffffed6.m_int,
                                            CONCAT24(in_stack_fffffffffffffed4,
                                                     in_stack_fffffffffffffed0.m_int))));
  operator^((char)((uint)in_stack_fffffffffffffecc >> 0x18),in_stack_fffffffffffffed0);
  local_5 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffed7.m_int,
                                   CONCAT16(in_stack_fffffffffffffed6.m_int,
                                            CONCAT24(in_stack_fffffffffffffed4,
                                                     in_stack_fffffffffffffed0.m_int))));
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator^=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_fffffffffffffedf,
                         CONCAT43(in_stack_fffffffffffffedb,
                                  CONCAT12(in_stack_fffffffffffffeda,
                                           CONCAT11(in_stack_fffffffffffffed9,
                                                    in_stack_fffffffffffffed8)))),
             in_stack_fffffffffffffee7);
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator^=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_fffffffffffffed7.m_int,
                         CONCAT16(in_stack_fffffffffffffed6.m_int,
                                  CONCAT24(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0.m_int
                                          ))),in_stack_fffffffffffffecc);
  rhs_05.m_int._2_1_ = in_stack_fffffffffffffee6.m_int;
  rhs_05.m_int._0_2_ = in_stack_fffffffffffffee4;
  rhs_05.m_int._3_1_ = in_stack_fffffffffffffee7.m_int;
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator^=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_fffffffffffffedf,
                         CONCAT43(in_stack_fffffffffffffedb,
                                  CONCAT12(in_stack_fffffffffffffeda,
                                           CONCAT11(in_stack_fffffffffffffed9,
                                                    in_stack_fffffffffffffed8)))),rhs_05);
  local_6 = operator<(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0);
  local_6 = operator<(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0.m_int);
  local_6 = operator<(in_stack_fffffffffffffed0.m_int,in_stack_fffffffffffffed7);
  local_6 = operator<(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0);
  local_6 = operator<=(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0);
  local_6 = operator<=(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0.m_int);
  local_6 = operator<=(in_stack_fffffffffffffed0.m_int,in_stack_fffffffffffffed7);
  local_6 = operator<=(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0);
  local_6 = operator>(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0);
  local_6 = operator>(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0.m_int);
  local_6 = operator>(in_stack_fffffffffffffed0.m_int,in_stack_fffffffffffffed7);
  local_6 = operator>(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0);
  local_6 = operator>=(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0);
  local_6 = operator>=(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0.m_int);
  local_6 = operator>=(in_stack_fffffffffffffed0.m_int,in_stack_fffffffffffffed7);
  local_6 = operator>=(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0);
  local_6 = operator==(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0);
  local_6 = operator==(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0.m_int);
  local_6 = operator==(in_stack_fffffffffffffed0.m_int,in_stack_fffffffffffffed7);
  operator==(local_c._3_1_,in_stack_fffffffffffffed0);
  return;
}

Assistant:

void CompiledMixedType()
{
	// Mixed constructors
	U u = 0;
	T t = 0;
	bool b = false;
	SafeInt<T> st(u);
	SafeInt<U> su(u);
	SafeInt<T> st2(su);

	// Shut up the compiler
	b = !b;

	// Assignment
	st = t;
	st = u;
	st = su;
	st = st2;

	// Casting
	U u2 = (U)st;

	// Multiplication
	t = st * u;
	t = st * st2;
	t = u * st;
	st *= u;
	st *= su;

	// Modulus, modulus assignment
	u = 1;
	st = 1;
	su = 1;
	// For some reason, this is annoying the VS17 link time code generation
//	t = u % st;

	t = st % u;
	st2 = 1;
	t = st % st2;
	st %= u;
	st %= su;

	// Division
	u = 1;
	st2 = 1;
	st = 1;
	t = st / u;
	t = st / st2;
	t = u / st;
	st /= u;
	st /= su;

	// Addition
	t = st + u;
	t = st + st2;
	t = u + st;
	st += u;
	st += su;

	// Subtraction
	st = 0;
	u = 0;
	st2 = 0;
	t = st - u;
	t = st - st2;
	t = u - st;
	st -= u;

	st = 1;
	su = 1;
	st -= su;

	// Shift operators
	u = 1;
	su = 1;
	// Left
	t = st << u;
	t = st << su;
	t = t << su;

	st <<= u;
	st <<= su;

	// Right
	t = st >> u;
	t = st >> su;
	t = t >> su;

	st >>= u;
	st >>= su;

	// Binary operations
	// And
	t = st & st2;
	t = st & u;
	t = t & su;

	st &= st2;
	st &= u;
	st &= su;

	// Or
	t = st | st2;
	t = st | u;
	t = t | su;

	st |= st2;
	st |= u;
	st |= su;

	// Xor
	t = st ^ st2;
	t = st ^ u;
	t = t ^ su;

	st ^= st2;
	st ^= u;
	st ^= su;

	// Comparisons
	// Less than
	b = st < su;
	b = st < u;
	b = u < st;
	b = st < su;

	// Less than or equal
	b = st <= su;
	b = st <= u;
	b = u <= st;
	b = st <= su;

	// Greater than
	b = st > su;
	b = st > u;
	b = u > st;
	b = st > su;

	// Greater than or equal
	b = st >= su;
	b = st >= u;
	b = u >= st;
	b = st >= su;

	// Equals
	b = st == su;
	b = st == u;
	b = u == st;
	b = st == su;
}